

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.c
# Opt level: O0

void async_create_run(int *pipe_dsc)

{
  int iVar1;
  char *local_48;
  char *child_argv [3];
  char local_28 [8];
  char parent_pid_str [12];
  pid_t child_pid;
  ssize_t tmp_err;
  int *pipe_dsc_local;
  
  parent_pid_str._4_4_ = fork();
  if (parent_pid_str._4_4_ == -1) {
    err = true;
  }
  else {
    if (parent_pid_str._4_4_ == 0) {
      validator_mq_finish(false,validator_mq,&err);
      if ((err & 1U) != 0) {
        kill_all_exit();
      }
      iVar1 = close(0);
      register0x00000000 = (long)iVar1;
      if (register0x00000000 != 0) {
        exit(1);
      }
      iVar1 = dup(*pipe_dsc);
      register0x00000000 = (long)iVar1;
      if (register0x00000000 != 0) {
        exit(1);
      }
      iVar1 = close(*pipe_dsc);
      register0x00000000 = (long)iVar1;
      if (register0x00000000 != 0) {
        exit(1);
      }
      iVar1 = close(pipe_dsc[1]);
      register0x00000000 = (long)iVar1;
      if (register0x00000000 != 0) {
        exit(1);
      }
      sprintf(local_28,"%d",(ulong)(uint)main_pid);
      local_48 = "run";
      child_argv[0] = local_28;
      child_argv[1] = (char *)0x0;
      execvp("./run",&local_48);
      exit(1);
    }
    await_forks = await_forks + 1;
    await_runs = await_runs + 1;
    pid_list_emplace(children,parent_pid_str._4_4_,&err);
  }
  return;
}

Assistant:

static void async_create_run(int *pipe_dsc) {
    assert(!halt_flag_raised);
    assert(err == false);

    ssize_t tmp_err;
    pid_t child_pid;
    switch (child_pid = fork()) {
        case -1:
            err = true;
            break;
        case 0:
            validator_mq_finish(false, validator_mq, &err);
            HANDLE_ERR(kill_all_exit);

            // pipe to child input descriptor
            tmp_err = close(0);
            if(tmp_err) {
                exit(EXIT_FAILURE);
            }
            tmp_err = dup(pipe_dsc[0]);
            if(tmp_err) {
                exit(EXIT_FAILURE);
            }
            tmp_err = close(pipe_dsc[0]);
            if(tmp_err) {
                exit(EXIT_FAILURE);
            }
            tmp_err = close(pipe_dsc[1]);
            if(tmp_err) {
                exit(EXIT_FAILURE);
            }

            // exec child
            char parent_pid_str[PID_STR_LEN];
            sprintf(parent_pid_str, "%d", main_pid);
            char * child_argv[] = {"run", parent_pid_str, NULL};

            execvp("./run", child_argv);
            exit(EXIT_FAILURE);
        default:
            await_forks++;
            await_runs++;
            pid_list_emplace(children, child_pid, &err);
            break;
    }
}